

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging_cfg.c
# Opt level: O0

int oonf_logcfg_apply(cfg_db *db)

{
  char *__filename;
  bool bVar1;
  void *__stream;
  int iVar2;
  int iVar3;
  cfg_named_section *named_00;
  const_strarray *pcVar4;
  FILE *pFVar5;
  int *piVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  FILE *f_1;
  FILE *f;
  _Bool activate_stderr;
  _Bool activate_file;
  _Bool activate_syslog;
  int file_errno;
  char *file_name;
  char *ptr;
  cfg_named_section *named;
  cfg_db *db_local;
  
  f._4_4_ = 0;
  memset(_logging_cfg,0xc,0x80);
  named_00 = cfg_db_find_namedsection(db,"log",(char *)0x0);
  if (named_00 != (cfg_named_section *)0x0) {
    _apply_log_setting(named_00,"info",LOG_SEVERITY_INFO);
    _apply_log_setting(named_00,"debug",LOG_SEVERITY_DEBUG);
  }
  memcpy(_syslog_handler.user_bitmask,_logging_cfg,0x80);
  memcpy(_stderr_handler.user_bitmask,_logging_cfg,0x80);
  memcpy(_file_handler.user_bitmask,_logging_cfg,0x80);
  pcVar4 = cfg_db_get_entry_value(db,"log",(char *)0x0,"syslog");
  iVar2 = cfg_get_choice_index(pcVar4->value,cfg_get_choice_array_value,4,CFGLIST_BOOL_TRUE);
  bVar9 = -1 < iVar2;
  pcVar4 = cfg_db_get_entry_value(db,"log",(char *)0x0,"file");
  __filename = pcVar4->value;
  bVar8 = false;
  if (__filename != (char *)0x0) {
    bVar8 = *__filename != '\0';
  }
  pcVar4 = cfg_db_get_entry_value(db,"log",(char *)0x0,"stderr");
  iVar2 = cfg_get_choice_index(pcVar4->value,cfg_get_choice_array_value,4,CFGLIST_BOOL_TRUE);
  pcVar4 = cfg_db_get_entry_value(db,"log",(char *)0x0,"stderr_color");
  iVar3 = cfg_get_choice_index(pcVar4->value,cfg_get_choice_array_value,4,CFGLIST_BOOL_TRUE);
  __stream = _file_handler.custom;
  _stderr_color = -1 < iVar3;
  if ((bVar8) &&
     (_file_handler._node.next == (list_entity *)0x0 ||
      _file_handler._node.prev == (list_entity *)0x0)) {
    pFVar5 = fopen(__filename,"w");
    if (pFVar5 == (FILE *)0x0) {
      piVar6 = __errno_location();
      f._4_4_ = *piVar6;
      bVar8 = false;
    }
    else {
      oonf_log_addhandler(&_file_handler);
      _file_handler.custom = pFVar5;
    }
  }
  else if ((!bVar8) &&
          (_file_handler._node.next != (list_entity *)0x0 &&
           _file_handler._node.prev != (list_entity *)0x0)) {
    oonf_log_removehandler(&_file_handler);
    fflush((FILE *)__stream);
    fclose((FILE *)__stream);
  }
  bVar1 = true;
  if (!bVar9) {
    bVar1 = bVar8;
  }
  if ((iVar2 < 0 && bVar1) ||
     (_stderr_handler._node.next != (list_entity *)0x0 &&
      _stderr_handler._node.prev != (list_entity *)0x0)) {
    if ((iVar2 < 0 && bVar1) &&
       (_stderr_handler._node.next != (list_entity *)0x0 &&
        _stderr_handler._node.prev != (list_entity *)0x0)) {
      oonf_log_removehandler(&_stderr_handler);
    }
  }
  else {
    oonf_log_addhandler(&_stderr_handler);
  }
  if ((config_global.fork & 1U) != 0) {
    bVar9 = bVar9 || !bVar8;
  }
  if ((bVar9) &&
     (_syslog_handler._node.next == (list_entity *)0x0 ||
      _syslog_handler._node.prev == (list_entity *)0x0)) {
    oonf_log_addhandler(&_syslog_handler);
  }
  else if ((!bVar9) &&
          (_syslog_handler._node.next != (list_entity *)0x0 &&
           _syslog_handler._node.prev != (list_entity *)0x0)) {
    oonf_log_removehandler(&_syslog_handler);
  }
  oonf_log_updatemask();
  if (f._4_4_ == 0) {
    db_local._4_4_ = 0;
  }
  else {
    if ((log_global_mask[1] & 4) != 0) {
      pcVar7 = strerror(f._4_4_);
      oonf_log(LOG_SEVERITY_WARN,LOG_MAIN,"src/libcore/oonf_logging_cfg.c",0xea,(void *)0x0,0,
               "Cannot open file \'%s\' for logging: %s (%d)",__filename,pcVar7,f._4_4_);
    }
    db_local._4_4_ = 1;
  }
  return db_local._4_4_;
}

Assistant:

int
oonf_logcfg_apply(struct cfg_db *db) {
  struct cfg_named_section *named;
  const char *ptr, *file_name;
  int file_errno = 0;
  bool activate_syslog, activate_file, activate_stderr;

  /* clean up logging mask */
  oonf_log_mask_clear(_logging_cfg);

  /* now apply specific settings */
  named = cfg_db_find_namedsection(db, LOG_SECTION, NULL);
  if (named != NULL) {
    _apply_log_setting(named, LOG_INFO_ENTRY, LOG_SEVERITY_INFO);
    _apply_log_setting(named, LOG_DEBUG_ENTRY, LOG_SEVERITY_DEBUG);
  }

  oonf_log_mask_copy(_syslog_handler.user_bitmask, _logging_cfg);
  oonf_log_mask_copy(_stderr_handler.user_bitmask, _logging_cfg);
  oonf_log_mask_copy(_file_handler.user_bitmask, _logging_cfg);

  /* load settings which loggershould be activated */
  ptr = cfg_db_get_entry_value(db, LOG_SECTION, NULL, LOG_SYSLOG_ENTRY)->value;
  activate_syslog = cfg_get_bool(ptr);

  file_name = cfg_db_get_entry_value(db, LOG_SECTION, NULL, LOG_FILE_ENTRY)->value;
  activate_file = file_name != NULL && *file_name != 0;

  ptr = cfg_db_get_entry_value(db, LOG_SECTION, NULL, LOG_STDERR_ENTRY)->value;
  activate_stderr = cfg_get_bool(ptr);

  ptr = cfg_db_get_entry_value(db, LOG_SECTION, NULL, LOG_STDERR_COLOR_ENTRY)->value;
  _stderr_color = cfg_get_bool(ptr);

  /* and finally modify the logging handlers */
  /* log.file */
  if (activate_file && !list_is_node_added(&_file_handler._node)) {
    FILE *f;

    f = fopen(file_name, "w");
    if (f != NULL) {
      oonf_log_addhandler(&_file_handler);
      _file_handler.custom = f;
    }
    else {
      file_errno = errno;
      activate_file = false;
    }
  }
  else if (!activate_file && list_is_node_added(&_file_handler._node)) {
    FILE *f = _file_handler.custom;
    oonf_log_removehandler(&_file_handler);

    fflush(f);
    fclose(f);
  }

  /* log.stderr (activate if syslog and file are offline) */
  activate_stderr |= !(activate_syslog || activate_file);

  if (activate_stderr && !list_is_node_added(&_stderr_handler._node)) {
    oonf_log_addhandler(&_stderr_handler);
  }
  else if (!activate_stderr && list_is_node_added(&_stderr_handler._node)) {
    oonf_log_removehandler(&_stderr_handler);
  }

  /* log.syslog */
  if (config_global.fork) {
    activate_syslog |= !activate_file;
  }

  if (activate_syslog && !list_is_node_added(&_syslog_handler._node)) {
    oonf_log_addhandler(&_syslog_handler);
  }
  else if (!activate_syslog && list_is_node_added(&_syslog_handler._node)) {
    oonf_log_removehandler(&_syslog_handler);
  }

  /* reload logging mask */
  oonf_log_updatemask();

  if (file_errno) {
    OONF_WARN(LOG_MAIN, "Cannot open file '%s' for logging: %s (%d)", file_name, strerror(file_errno), file_errno);
    return 1;
  }

  return 0;
}